

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mesh_output_demo.cc
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  element_type *peVar2;
  char *filename_00;
  StructuredMeshBuilder *pSVar3;
  undefined1 local_2a0 [16];
  undefined1 local_290 [8];
  shared_ptr<const_lf::mesh::Mesh> mesh_p_1;
  Matrix<double,_2,_1,_0,_2,_1> local_278;
  int local_260 [2];
  Matrix<double,_2,_1,_0,_2,_1> local_258;
  undefined4 local_23c;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  local_238;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_230;
  undefined1 local_228 [8];
  TPTriagMeshBuilder builder;
  stringstream local_1c8 [8];
  stringstream filename;
  ostream local_1b8 [392];
  test_utils local_30 [16];
  undefined1 local_20 [8];
  shared_ptr<const_lf::mesh::Mesh> mesh_p;
  int selector;
  
  mesh_p.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,"LehrFEM++ demo: output of test meshes");
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "(test meshes from lf::mesh::test_utils::GenerateHybrid2DTestMesh()");
  std::operator<<(poVar1,'\n');
  for (mesh_p.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       ._0_4_ = 0;
      (uint)mesh_p.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi < 9;
      mesh_p.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = (uint)mesh_p.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 1) {
    lf::mesh::test_utils::GenerateHybrid2DTestMesh
              (local_30,(uint)mesh_p.
                              super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,1.0);
    std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
              ((shared_ptr<lf::mesh::Mesh_const> *)local_20,(shared_ptr<lf::mesh::Mesh> *)local_30);
    std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)local_30);
    poVar1 = std::operator<<((ostream *)&std::cout,"#### Test mesh ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(uint)mesh_p.
                                     super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    poVar1 = std::operator<<(poVar1," ####");
    std::operator<<(poVar1,'\n');
    peVar2 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_20);
    lf::mesh::utils::PrintInfo((ostream *)&std::cout,peVar2,0xb);
    std::__cxx11::stringstream::stringstream(local_1c8);
    poVar1 = std::operator<<(local_1b8,"test_mesh_");
    std::ostream::operator<<
              (poVar1,(uint)mesh_p.
                            super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi);
    std::__cxx11::stringstream::str();
    filename_00 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &builder.super_StructuredMeshBuilder.field_0x38);
    writeMeshRenderingData((shared_ptr<const_lf::mesh::Mesh> *)local_20,filename_00);
    std::__cxx11::string::~string((string *)&builder.super_StructuredMeshBuilder.field_0x38);
    std::__cxx11::stringstream::~stringstream(local_1c8);
    std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr((shared_ptr<const_lf::mesh::Mesh> *)local_20)
    ;
  }
  local_23c = 2;
  std::make_unique<lf::mesh::hybrid2d::MeshFactory,int>((int *)&local_238);
  std::unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>>::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,std::default_delete<lf::mesh::hybrid2d::MeshFactory>,void>
            ((unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>> *)
             &local_230,&local_238);
  lf::mesh::utils::TPTriagMeshBuilder::TPTriagMeshBuilder
            ((TPTriagMeshBuilder *)local_228,&local_230);
  std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::~unique_ptr
            (&local_230);
  std::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  ::~unique_ptr(&local_238);
  local_260[1] = 0;
  local_260[0] = 0;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>
            ((Matrix<double,2,1,0,2,1> *)&local_258,local_260 + 1,local_260);
  pSVar3 = lf::mesh::utils::StructuredMeshBuilder::
           setBottomLeftCorner<Eigen::Matrix<double,2,1,0,2,1>>
                     ((StructuredMeshBuilder *)local_228,&local_258);
  mesh_p_1.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = 1;
  mesh_p_1.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = 1;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>
            ((Matrix<double,2,1,0,2,1> *)&local_278,
             (int *)((long)&mesh_p_1.
                            super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             (int *)&mesh_p_1.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  pSVar3 = lf::mesh::utils::StructuredMeshBuilder::
           setTopRightCorner<Eigen::Matrix<double,2,1,0,2,1>>(pSVar3,&local_278);
  pSVar3 = lf::mesh::utils::StructuredMeshBuilder::setNumXCells(pSVar3,2);
  lf::mesh::utils::StructuredMeshBuilder::setNumYCells(pSVar3,2);
  lf::mesh::utils::TPTriagMeshBuilder::Build((TPTriagMeshBuilder *)local_2a0);
  std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
            ((shared_ptr<lf::mesh::Mesh_const> *)local_290,(shared_ptr<lf::mesh::Mesh> *)local_2a0);
  std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)local_2a0);
  poVar1 = std::operator<<((ostream *)&std::cout,"#### Triangular tensor product 2x2 mesh #####");
  std::operator<<(poVar1,'\n');
  peVar2 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_290);
  lf::mesh::utils::PrintInfo((ostream *)&std::cout,peVar2,0xb);
  writeMeshRenderingData((shared_ptr<const_lf::mesh::Mesh> *)local_290,"tp_tria_mesh");
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr((shared_ptr<const_lf::mesh::Mesh> *)local_290);
  lf::mesh::utils::TPTriagMeshBuilder::~TPTriagMeshBuilder((TPTriagMeshBuilder *)local_228);
  return 0;
}

Assistant:

int main() {
  std::cout << "LehrFEM++ demo: output of test meshes" << '\n';
  std::cout << "(test meshes from "
               "lf::mesh::test_utils::GenerateHybrid2DTestMesh()"
            << '\n';
  for (int selector = 0;
       selector <= lf::mesh::test_utils::GenerateHybrid2DTestMesh_maxsel;
       selector++) {
    // Generates a small test meshes, more precisely described in the
    // documentation of the function GenerateHybrid2DTestMesh()
    const std::shared_ptr<const lf::mesh::Mesh> mesh_p =
        lf::mesh::test_utils::GenerateHybrid2DTestMesh(selector);
    // Output of mesh information
    std::cout << "#### Test mesh " << selector << " ####" << '\n';
    lf::mesh::utils::PrintInfo(std::cout, *mesh_p);

    std::stringstream filename;
    filename << "test_mesh_" << selector;
    writeMeshRenderingData(mesh_p, filename.str().c_str());
  }

  {
    // Initialize builder object
    lf::mesh::utils::TPTriagMeshBuilder builder(
        std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2));
    // Set mesh parameters following the Builder pattern
    // Domain is the unit square, two cells in every direction
    builder.setBottomLeftCorner(Eigen::Vector2d{0, 0})
        .setTopRightCorner(Eigen::Vector2d{1, 1})
        .setNumXCells(2)
        .setNumYCells(2);
    const std::shared_ptr<const lf::mesh::Mesh> mesh_p = builder.Build();
    // Output of mesh information
    std::cout << "#### Triangular tensor product 2x2 mesh #####" << '\n';
    lf::mesh::utils::PrintInfo(std::cout, *mesh_p);

    writeMeshRenderingData(mesh_p, "tp_tria_mesh");
  }
  return 0L;
}